

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_io_dp.c
# Opt level: O0

int dynamicGetchar(gdIOCtxPtr ctx)

{
  int iVar1;
  byte local_19;
  int rv;
  uchar b;
  gdIOCtxPtr ctx_local;
  
  _rv = ctx;
  iVar1 = dynamicGetbuf(ctx,&local_19,1);
  if (iVar1 == 1) {
    ctx_local._4_4_ = (uint)local_19;
  }
  else {
    ctx_local._4_4_ = 0xffffffff;
  }
  return ctx_local._4_4_;
}

Assistant:

static int dynamicGetchar(gdIOCtxPtr ctx)
{
	unsigned char b;
	int rv;

	rv = dynamicGetbuf(ctx, &b, 1);

	if(rv != 1) {
		return EOF;
	} else {
		return b; /* (b & 0xff); */
	}
}